

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O3

SC_Man * Abc_SclManStart(SC_Lib *pLib,Abc_Ntk_t *pNtk,int fUseWireLoads,int fDept,float DUser,
                        int nTreeCRatio)

{
  size_t __size;
  long *plVar1;
  long lVar2;
  char *__s;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  SC_Man *p;
  SC_Pair *pSVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  Vec_Flt_t *pVVar11;
  float *pfVar12;
  Vec_Que_t *pVVar13;
  int *piVar14;
  Vec_Wec_t *pVVar15;
  Vec_Ptr_t *pVVar16;
  SC_WireLoad *pSVar17;
  char *__dest;
  Vec_Ptr_t *pVVar18;
  long lVar19;
  size_t sVar20;
  uint uVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  uint uVar25;
  long lVar26;
  float fVar27;
  float fVar28;
  
  if (pLib->unit_time != 0xc) {
    __assert_fail("pLib->unit_time == 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclSize.h"
                  ,0x98,"SC_Man *Abc_SclManAlloc(SC_Lib *, Abc_Ntk_t *)");
  }
  if (pLib->unit_cap_snd != 0xf) {
    __assert_fail("pLib->unit_cap_snd == 15",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclSize.h"
                  ,0x99,"SC_Man *Abc_SclManAlloc(SC_Lib *, Abc_Ntk_t *)");
  }
  if (pNtk->ntkFunc != ABC_FUNC_MAP) {
    __assert_fail("Abc_NtkHasMapping(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclSize.h"
                  ,0x9a,"SC_Man *Abc_SclManAlloc(SC_Lib *, Abc_Ntk_t *)");
  }
  p = (SC_Man *)calloc(1,0x130);
  p->pLib = pLib;
  p->pNtk = pNtk;
  uVar25 = pNtk->vObjs->nSize;
  p->nObjs = uVar25;
  sVar20 = (size_t)(int)uVar25;
  pSVar8 = (SC_Pair *)calloc(sVar20,8);
  p->pLoads = pSVar8;
  pSVar8 = (SC_Pair *)calloc(sVar20,8);
  p->pDepts = pSVar8;
  pSVar8 = (SC_Pair *)calloc(sVar20,8);
  p->pTimes = pSVar8;
  pSVar8 = (SC_Pair *)calloc(sVar20,8);
  p->pSlews = pSVar8;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  uVar5 = uVar25 - 1;
  uVar21 = 0x10;
  if (0xe < uVar5) {
    uVar21 = uVar25;
  }
  pVVar9->nCap = uVar21;
  if (uVar21 == 0) {
    pVVar9->pArray = (int *)0x0;
    pVVar9->nSize = uVar25;
  }
  else {
    piVar10 = (int *)malloc((long)(int)uVar21 << 2);
    pVVar9->pArray = piVar10;
    pVVar9->nSize = uVar25;
    if (piVar10 != (int *)0x0) {
      memset(piVar10,0,sVar20 << 2);
    }
  }
  p->vBestFans = pVVar9;
  pVVar16 = pNtk->vCos;
  iVar23 = pVVar16->nSize;
  pVVar11 = (Vec_Flt_t *)malloc(0x10);
  iVar6 = iVar23;
  if (iVar23 - 1U < 0xf) {
    iVar6 = 0x10;
  }
  pVVar11->nCap = iVar6;
  if (iVar6 == 0) {
    pfVar12 = (float *)0x0;
  }
  else {
    pfVar12 = (float *)malloc((long)iVar6 << 2);
  }
  pVVar11->pArray = pfVar12;
  pVVar11->nSize = iVar23;
  memset(pfVar12,0,(long)iVar23 << 2);
  p->vTimesOut = pVVar11;
  uVar21 = pVVar16->nSize;
  pVVar13 = (Vec_Que_t *)calloc(1,0x20);
  uVar4 = 0x10;
  if (0x10 < (int)uVar21) {
    uVar4 = uVar21;
  }
  pVVar13->nSize = 1;
  pVVar13->nCap = uVar4 + 1;
  sVar20 = (ulong)uVar4 * 4 + 4;
  piVar10 = (int *)malloc(sVar20);
  memset(piVar10,0xff,sVar20);
  pVVar13->pHeap = piVar10;
  piVar10 = (int *)malloc(sVar20);
  memset(piVar10,0xff,sVar20);
  pVVar13->pOrder = piVar10;
  p->vQue = pVVar13;
  pVVar13->pCostsFlt = &pVVar11->pArray;
  if (0 < pVVar16->nSize) {
    uVar24 = 0;
    do {
      pVVar13 = p->vQue;
      uVar25 = pVVar13->nCap;
      if (pVVar13->nSize < (int)uVar25) {
        lVar26 = (long)(int)uVar25;
      }
      else {
        uVar5 = pVVar13->nSize + 1;
        uVar21 = uVar25 * 2;
        iVar23 = uVar25 * -2;
        uVar25 = uVar21;
        if (uVar5 != uVar21 && SBORROW4(uVar5,uVar21) == (int)(uVar5 + iVar23) < 0) {
          uVar25 = uVar5;
        }
        lVar26 = (long)(int)uVar25;
        sVar20 = lVar26 * 4;
        if (pVVar13->pHeap == (int *)0x0) {
          piVar10 = (int *)malloc(sVar20);
        }
        else {
          piVar10 = (int *)realloc(pVVar13->pHeap,sVar20);
        }
        pVVar13->pHeap = piVar10;
        if (pVVar13->pOrder == (int *)0x0) {
          piVar14 = (int *)malloc(sVar20);
        }
        else {
          piVar14 = (int *)realloc(pVVar13->pOrder,sVar20);
          piVar10 = pVVar13->pHeap;
        }
        pVVar13->pOrder = piVar14;
        memset(piVar10 + pVVar13->nCap,0xff,((long)(int)uVar25 - (long)pVVar13->nCap) * 4);
        memset(pVVar13->pOrder + pVVar13->nCap,0xff,((long)(int)uVar25 - (long)pVVar13->nCap) * 4);
        pVVar13->nCap = uVar25;
      }
      iVar23 = (int)uVar24;
      if (lVar26 <= (long)uVar24) {
        uVar21 = uVar25 * 2;
        uVar5 = iVar23 + 1;
        iVar6 = uVar25 * -2;
        uVar25 = uVar21;
        if (uVar5 != uVar21 && SBORROW4(uVar5,uVar21) == (int)(uVar5 + iVar6) < 0) {
          uVar25 = uVar5;
        }
        sVar20 = (ulong)uVar25 * 4;
        if (pVVar13->pHeap == (int *)0x0) {
          piVar10 = (int *)malloc(sVar20);
        }
        else {
          piVar10 = (int *)realloc(pVVar13->pHeap,sVar20);
        }
        pVVar13->pHeap = piVar10;
        if (pVVar13->pOrder == (int *)0x0) {
          piVar14 = (int *)malloc(sVar20);
        }
        else {
          piVar14 = (int *)realloc(pVVar13->pOrder,sVar20);
          piVar10 = pVVar13->pHeap;
        }
        pVVar13->pOrder = piVar14;
        memset(piVar10 + pVVar13->nCap,0xff,((long)(int)uVar25 - (long)pVVar13->nCap) * 4);
        memset(pVVar13->pOrder + pVVar13->nCap,0xff,((long)(int)uVar25 - (long)pVVar13->nCap) * 4);
        pVVar13->nCap = uVar25;
      }
      iVar6 = pVVar13->nSize;
      if ((int)uVar25 <= iVar6) {
        __assert_fail("p->nSize < p->nCap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                      ,0xe3,"void Vec_QuePush(Vec_Que_t *, int)");
      }
      piVar10 = pVVar13->pOrder;
      if (piVar10[uVar24] != -1) {
        __assert_fail("p->pOrder[v] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                      ,0xe4,"void Vec_QuePush(Vec_Que_t *, int)");
      }
      piVar14 = pVVar13->pHeap;
      if (piVar14[iVar6] != -1) {
        __assert_fail("p->pHeap[p->nSize] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                      ,0xe5,"void Vec_QuePush(Vec_Que_t *, int)");
      }
      piVar10[uVar24] = iVar6;
      iVar6 = pVVar13->nSize;
      pVVar13->nSize = iVar6 + 1;
      piVar14[iVar6] = iVar23;
      pfVar12 = *pVVar13->pCostsFlt;
      if (pfVar12 == (float *)0x0) {
        fVar27 = (float)iVar23;
      }
      else {
        fVar27 = pfVar12[uVar24];
      }
      uVar25 = piVar10[uVar24];
      uVar22 = (ulong)(int)uVar25;
      if (uVar22 == 0xffffffffffffffff) {
        __assert_fail("p->pOrder[v] != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                      ,0xa5,"int Vec_QueMoveUp(Vec_Que_t *, int)");
      }
      if (uVar24 != (uint)piVar14[uVar22]) {
        __assert_fail("p->pHeap[i] == v",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                      ,0xa6,"int Vec_QueMoveUp(Vec_Que_t *, int)");
      }
      if (1 < (int)uVar25) {
        do {
          uVar21 = uVar25 >> 1;
          iVar6 = piVar14[uVar21];
          if (pfVar12 == (float *)0x0) {
            fVar28 = (float)iVar6;
          }
          else {
            fVar28 = pfVar12[iVar6];
          }
          uVar22 = (ulong)uVar25;
          if (fVar27 <= fVar28) break;
          piVar14[uVar25] = iVar6;
          piVar10[iVar6] = uVar25;
          bVar3 = 3 < uVar25;
          uVar22 = (ulong)uVar21;
          uVar25 = uVar21;
        } while (bVar3);
      }
      piVar14[uVar22] = iVar23;
      piVar10[uVar24] = uVar25;
      uVar24 = uVar24 + 1;
    } while ((long)uVar24 < (long)pNtk->vCos->nSize);
    uVar25 = p->nObjs;
    uVar5 = uVar25 - 1;
  }
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 1000;
  pVVar9->nSize = 0;
  piVar10 = (int *)malloc(4000);
  pVVar9->pArray = piVar10;
  p->vUpdates = pVVar9;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 1000;
  pVVar9->nSize = 0;
  piVar10 = (int *)malloc(4000);
  pVVar9->pArray = piVar10;
  p->vUpdates2 = pVVar9;
  pVVar11 = (Vec_Flt_t *)malloc(0x10);
  pVVar11->nCap = 1000;
  pVVar11->nSize = 0;
  pfVar12 = (float *)malloc(4000);
  pVVar11->pArray = pfVar12;
  p->vLoads2 = pVVar11;
  pVVar11 = (Vec_Flt_t *)malloc(0x10);
  pVVar11->nCap = 1000;
  pVVar11->nSize = 0;
  pfVar12 = (float *)malloc(4000);
  pVVar11->pArray = pfVar12;
  p->vLoads3 = pVVar11;
  pVVar11 = (Vec_Flt_t *)malloc(0x10);
  pVVar11->nCap = 1000;
  pVVar11->nSize = 0;
  pfVar12 = (float *)malloc(4000);
  pVVar11->pArray = pfVar12;
  p->vTimes2 = pVVar11;
  pVVar11 = (Vec_Flt_t *)malloc(0x10);
  pVVar11->nCap = 1000;
  pVVar11->nSize = 0;
  pfVar12 = (float *)malloc(4000);
  pVVar11->pArray = pfVar12;
  p->vTimes3 = pVVar11;
  pVVar11 = (Vec_Flt_t *)malloc(0x10);
  uVar21 = 0x10;
  if (0xe < uVar5) {
    uVar21 = uVar25;
  }
  pVVar11->nCap = uVar21;
  lVar26 = (long)(int)uVar21;
  if (uVar21 == 0) {
    pfVar12 = (float *)0x0;
  }
  else {
    pfVar12 = (float *)malloc(lVar26 * 4);
  }
  pVVar11->pArray = pfVar12;
  pVVar11->nSize = uVar25;
  sVar20 = (long)(int)uVar25 << 2;
  memset(pfVar12,0,sVar20);
  p->vNode2Gain = pVVar11;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = uVar21;
  if (uVar21 == 0) {
    pVVar9->pArray = (int *)0x0;
    pVVar9->nSize = uVar25;
  }
  else {
    piVar10 = (int *)malloc(lVar26 * 4);
    pVVar9->pArray = piVar10;
    pVVar9->nSize = uVar25;
    if (piVar10 != (int *)0x0) {
      memset(piVar10,0,sVar20);
    }
  }
  p->vNode2Gate = pVVar9;
  pVVar13 = (Vec_Que_t *)calloc(1,0x20);
  uVar24 = 0x10;
  if (0x10 < (int)uVar25) {
    uVar24 = (ulong)uVar25;
  }
  pVVar13->nSize = 1;
  pVVar13->nCap = (int)uVar24 + 1;
  __size = uVar24 * 4 + 4;
  piVar10 = (int *)malloc(__size);
  memset(piVar10,0xff,__size);
  pVVar13->pHeap = piVar10;
  piVar10 = (int *)malloc(__size);
  memset(piVar10,0xff,__size);
  pVVar13->pOrder = piVar10;
  p->vNodeByGain = pVVar13;
  pVVar13->pCostsFlt = &pVVar11->pArray;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = uVar21;
  if (uVar21 == 0) {
    pVVar9->pArray = (int *)0x0;
    pVVar9->nSize = uVar25;
  }
  else {
    piVar10 = (int *)malloc(lVar26 << 2);
    pVVar9->pArray = piVar10;
    pVVar9->nSize = uVar25;
    if (piVar10 != (int *)0x0) {
      memset(piVar10,0xff,sVar20);
    }
  }
  p->vNodeIter = pVVar9;
  iVar7 = Abc_NtkLevel(pNtk);
  iVar23 = iVar7 * 2 + 1;
  pVVar15 = (Vec_Wec_t *)malloc(0x10);
  iVar6 = 8;
  if (6 < (uint)(iVar7 * 2)) {
    iVar6 = iVar23;
  }
  pVVar15->nCap = iVar6;
  pVVar9 = (Vec_Int_t *)calloc((long)iVar6,0x10);
  pVVar15->pArray = pVVar9;
  pVVar15->nSize = iVar23;
  p->vLevels = pVVar15;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 100;
  pVVar9->nSize = 0;
  piVar10 = (int *)malloc(400);
  pVVar9->pArray = piVar10;
  p->vChanged = pVVar9;
  pVVar16 = pNtk->vCos;
  if (0 < pVVar16->nSize) {
    lVar26 = 0;
    do {
      plVar1 = (long *)pVVar16->pArray[lVar26];
      *(uint *)((long)plVar1 + 0x14) =
           (*(uint *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                               (long)*(int *)plVar1[4] * 8) + 0x14) & 0xfffff000) +
           (*(uint *)((long)plVar1 + 0x14) & 0xfff) + 0x1000;
      lVar26 = lVar26 + 1;
      pVVar16 = pNtk->vCos;
    } while (lVar26 < pVVar16->nSize);
  }
  pVVar18 = pNtk->vCis;
  if (0 < pVVar18->nSize) {
    lVar26 = 0;
    do {
      *(int *)((long)pVVar18->pArray[lVar26] + 0x38) = (int)lVar26;
      lVar26 = lVar26 + 1;
      pVVar18 = pNtk->vCis;
    } while (lVar26 < pVVar18->nSize);
    pVVar16 = pNtk->vCos;
  }
  if (0 < pVVar16->nSize) {
    lVar26 = 0;
    do {
      *(int *)((long)pVVar16->pArray[lVar26] + 0x38) = (int)lVar26;
      lVar26 = lVar26 + 1;
      pVVar16 = pNtk->vCos;
    } while (lVar26 < pVVar16->nSize);
  }
  if (nTreeCRatio != 0) {
    p->EstLoadMax = (float)nTreeCRatio * 0.01;
    p->EstLinear = 100.0;
  }
  Abc_SclMioGates2SclGates(pLib,pNtk);
  Abc_SclManReadSlewAndLoad(p,pNtk);
  if (fUseWireLoads != 0) {
    if (pNtk->pWLoadUsed == (char *)0x0) {
      pVVar16 = p->pNtk->vObjs;
      lVar26 = (long)pVVar16->nSize;
      if (lVar26 < 1) {
        fVar27 = 0.0;
      }
      else {
        fVar27 = 0.0;
        lVar19 = 0;
        do {
          plVar1 = (long *)pVVar16->pArray[lVar19];
          if ((((plVar1 != (long *)0x0) && ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 7)) &&
              (*(int *)((long)plVar1 + 0x1c) != 0)) &&
             (((lVar2 = *plVar1, *(int *)((long)plVar1 + 0x1c) != 1 || (*(int *)(lVar2 + 4) != 4))
              || (plVar1[7] != 0)))) {
            iVar23 = (int)plVar1[2];
            if (((long)iVar23 < 0) || (*(int *)(*(long *)(lVar2 + 0x178) + 4) <= iVar23)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar23 = *(int *)(*(long *)(*(long *)(lVar2 + 0x178) + 8) + (long)iVar23 * 4);
            if (((long)iVar23 < 0) || (*(int *)(*(long *)(lVar2 + 0x170) + 100) <= iVar23)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            fVar27 = fVar27 + *(float *)(*(long *)(*(long *)(*(long *)(lVar2 + 0x170) + 0x68) +
                                                  (long)iVar23 * 8) + 0x18);
          }
          lVar19 = lVar19 + 1;
        } while (lVar26 != lVar19);
      }
      pSVar17 = Abc_SclFindWireLoadModel(pLib,fVar27);
      p->pWLoadUsed = pSVar17;
      if (pSVar17 != (SC_WireLoad *)0x0) {
        __s = pSVar17->pName;
        if (__s == (char *)0x0) {
          __dest = (char *)0x0;
        }
        else {
          sVar20 = strlen(__s);
          __dest = (char *)malloc(sVar20 + 1);
          strcpy(__dest,__s);
        }
        pNtk->pWLoadUsed = __dest;
      }
    }
    else {
      pSVar17 = Abc_SclFetchWireLoadModel(pLib,pNtk->pWLoadUsed);
      p->pWLoadUsed = pSVar17;
    }
  }
  Abc_SclTimeNtkRecompute(p,&p->SumArea0,&p->MaxDelay0,fDept,DUser);
  p->SumArea = p->SumArea0;
  p->MaxDelay = p->MaxDelay0;
  return p;
}

Assistant:

SC_Man * Abc_SclManStart( SC_Lib * pLib, Abc_Ntk_t * pNtk, int fUseWireLoads, int fDept, float DUser, int nTreeCRatio )
{
    SC_Man * p = Abc_SclManAlloc( pLib, pNtk );
    if ( nTreeCRatio )
    {
        p->EstLoadMax = 0.01 * nTreeCRatio;  // max ratio of Cout/Cave when the estimation is used
        p->EstLinear  = 100;                  // linear coefficient
    }
    Abc_SclMioGates2SclGates( pLib, pNtk );
    Abc_SclManReadSlewAndLoad( p, pNtk );
    if ( fUseWireLoads )
    {
        if ( pNtk->pWLoadUsed == NULL )
        {            
            p->pWLoadUsed = Abc_SclFindWireLoadModel( pLib, Abc_SclGetTotalArea(p->pNtk) );
            if ( p->pWLoadUsed )
            pNtk->pWLoadUsed = Abc_UtilStrsav( p->pWLoadUsed->pName );
        }
        else
            p->pWLoadUsed = Abc_SclFetchWireLoadModel( pLib, pNtk->pWLoadUsed );
    }
    Abc_SclTimeNtkRecompute( p, &p->SumArea0, &p->MaxDelay0, fDept, DUser );
    p->SumArea  = p->SumArea0;
    p->MaxDelay = p->MaxDelay0;
    return p;
}